

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void magma_key(gost_ctx *c,byte *k)

{
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  undefined4 local_18;
  undefined4 local_14;
  
  RAND_priv_bytes(in_RDI + 0x40,0x20);
  local_18 = 0;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    *(int *)(in_RDI + 0x20 + (long)local_14 * 4) =
         CONCAT13(*(undefined1 *)(in_RSI + local_18),
                  CONCAT12(*(undefined1 *)(in_RSI + (local_18 + 1)),
                           CONCAT11(*(undefined1 *)(in_RSI + (local_18 + 2)),
                                    *(undefined1 *)(in_RSI + (local_18 + 3))))) -
         *(int *)(in_RDI + 0x40 + (long)local_14 * 4);
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void magma_key(gost_ctx * c, const byte * k)
{
    int i, j;
    RAND_priv_bytes((unsigned char *)c->mask, sizeof(c->mask));
    for (i = 0, j = 0; i < 8; ++i, j += 4) {
        c->key[i] =
            (k[j + 3] | (k[j + 2] << 8) | (k[j + 1] << 16) | ((word32) k[j] <<
                                                             24))  - c->mask[i];
    }
}